

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# certificate_policies.cc
# Opt level: O0

bool __thiscall
bssl::ParsePolicyConstraints(bssl *this,Input policy_constraints_tlv,ParsedPolicyConstraints *out)

{
  der *this_00;
  Input input;
  bool bVar1;
  Input *pIVar2;
  Input in;
  Input in_00;
  _Optional_payload_base<unsigned_char> local_d2;
  der *local_d0;
  uchar *local_c8;
  uchar local_b9;
  undefined1 local_b8 [7];
  uint8_t inhibit_policy_mapping;
  optional<bssl::der::Input> inhibit_value;
  uchar local_81;
  undefined1 local_80 [7];
  uint8_t require_explicit_policy;
  optional<bssl::der::Input> require_value;
  Parser sequence_parser;
  undefined1 local_40 [8];
  Parser parser;
  ParsedPolicyConstraints *out_local;
  Input policy_constraints_tlv_local;
  
  parser.advance_len_ = policy_constraints_tlv.data_.size_;
  input.data_.size_ = (size_t)policy_constraints_tlv.data_.data_;
  input.data_.data_ = (uchar *)this;
  der::Parser::Parser((Parser *)local_40,input);
  der::Parser::Parser((Parser *)
                      &require_value.super__Optional_base<bssl::der::Input,_true,_true>._M_payload.
                       super__Optional_payload_base<bssl::der::Input>._M_engaged);
  bVar1 = der::Parser::ReadSequence
                    ((Parser *)local_40,
                     (Parser *)
                     &require_value.super__Optional_base<bssl::der::Input,_true,_true>._M_payload.
                      super__Optional_payload_base<bssl::der::Input>._M_engaged);
  if (bVar1) {
    bVar1 = der::Parser::HasMore
                      ((Parser *)
                       &require_value.super__Optional_base<bssl::der::Input,_true,_true>._M_payload.
                        super__Optional_payload_base<bssl::der::Input>._M_engaged);
    if (bVar1) {
      ::std::optional<bssl::der::Input>::optional((optional<bssl::der::Input> *)local_80);
      bVar1 = der::Parser::ReadOptionalTag
                        ((Parser *)
                         &require_value.super__Optional_base<bssl::der::Input,_true,_true>.
                          _M_payload.super__Optional_payload_base<bssl::der::Input>._M_engaged,
                         0x80000000,(optional<bssl::der::Input> *)local_80);
      if (bVar1) {
        bVar1 = ::std::optional::operator_cast_to_bool((optional *)local_80);
        if (bVar1) {
          pIVar2 = ::std::optional<bssl::der::Input>::value((optional<bssl::der::Input> *)local_80);
          this_00 = (der *)(pIVar2->data_).data_;
          in.data_.size_ = (size_t)&local_81;
          in.data_.data_ = (uchar *)(pIVar2->data_).size_;
          bVar1 = der::ParseUint8(this_00,in,(uint8_t *)this_00);
          if (!bVar1) {
            return false;
          }
          ::std::optional<unsigned_char>::optional<unsigned_char_&,_true>
                    ((optional<unsigned_char> *)
                     &inhibit_value.super__Optional_base<bssl::der::Input,_true,_true>._M_payload.
                      super__Optional_payload_base<bssl::der::Input>.field_0x16,&local_81);
          *(undefined2 *)parser.advance_len_ =
               inhibit_value.super__Optional_base<bssl::der::Input,_true,_true>._M_payload.
               super__Optional_payload_base<bssl::der::Input>._22_2_;
        }
        ::std::optional<bssl::der::Input>::optional((optional<bssl::der::Input> *)local_b8);
        bVar1 = der::Parser::ReadOptionalTag
                          ((Parser *)
                           &require_value.super__Optional_base<bssl::der::Input,_true,_true>.
                            _M_payload.super__Optional_payload_base<bssl::der::Input>._M_engaged,
                           0x80000001,(optional<bssl::der::Input> *)local_b8);
        if (bVar1) {
          bVar1 = ::std::optional::operator_cast_to_bool((optional *)local_b8);
          if (bVar1) {
            pIVar2 = ::std::optional<bssl::der::Input>::value
                               ((optional<bssl::der::Input> *)local_b8);
            local_d0 = (der *)(pIVar2->data_).data_;
            local_c8 = (uchar *)(pIVar2->data_).size_;
            in_00.data_.size_ = (size_t)&local_b9;
            in_00.data_.data_ = local_c8;
            bVar1 = der::ParseUint8(local_d0,in_00,(uint8_t *)local_d0);
            if (!bVar1) {
              return false;
            }
            ::std::optional<unsigned_char>::optional<unsigned_char_&,_true>
                      ((optional<unsigned_char> *)&local_d2,&local_b9);
            *(_Optional_payload_base<unsigned_char> *)(parser.advance_len_ + 2) = local_d2;
          }
          bVar1 = der::Parser::HasMore
                            ((Parser *)
                             &require_value.super__Optional_base<bssl::der::Input,_true,_true>.
                              _M_payload.super__Optional_payload_base<bssl::der::Input>._M_engaged);
          if ((bVar1) || (bVar1 = der::Parser::HasMore((Parser *)local_40), bVar1)) {
            policy_constraints_tlv_local.data_.size_._7_1_ = false;
          }
          else {
            policy_constraints_tlv_local.data_.size_._7_1_ = true;
          }
        }
        else {
          policy_constraints_tlv_local.data_.size_._7_1_ = false;
        }
      }
      else {
        policy_constraints_tlv_local.data_.size_._7_1_ = false;
      }
    }
    else {
      policy_constraints_tlv_local.data_.size_._7_1_ = false;
    }
  }
  else {
    policy_constraints_tlv_local.data_.size_._7_1_ = false;
  }
  return policy_constraints_tlv_local.data_.size_._7_1_;
}

Assistant:

bool ParsePolicyConstraints(der::Input policy_constraints_tlv,
                            ParsedPolicyConstraints *out) {
  der::Parser parser(policy_constraints_tlv);

  //   PolicyConstraints ::= SEQUENCE {
  der::Parser sequence_parser;
  if (!parser.ReadSequence(&sequence_parser)) {
    return false;
  }

  // RFC 5280 prohibits CAs from issuing PolicyConstraints as an empty sequence:
  //
  //   Conforming CAs MUST NOT issue certificates where policy constraints
  //   is an empty sequence.  That is, either the inhibitPolicyMapping field
  //   or the requireExplicitPolicy field MUST be present.  The behavior of
  //   clients that encounter an empty policy constraints field is not
  //   addressed in this profile.
  if (!sequence_parser.HasMore()) {
    return false;
  }

  std::optional<der::Input> require_value;
  if (!sequence_parser.ReadOptionalTag(CBS_ASN1_CONTEXT_SPECIFIC | 0,
                                       &require_value)) {
    return false;
  }

  if (require_value) {
    uint8_t require_explicit_policy;
    if (!ParseUint8(require_value.value(), &require_explicit_policy)) {
      // TODO(eroman): Surface reason for failure if length was longer than
      // uint8.
      return false;
    }
    out->require_explicit_policy = require_explicit_policy;
  }

  std::optional<der::Input> inhibit_value;
  if (!sequence_parser.ReadOptionalTag(CBS_ASN1_CONTEXT_SPECIFIC | 1,
                                       &inhibit_value)) {
    return false;
  }

  if (inhibit_value) {
    uint8_t inhibit_policy_mapping;
    if (!ParseUint8(inhibit_value.value(), &inhibit_policy_mapping)) {
      // TODO(eroman): Surface reason for failure if length was longer than
      // uint8.
      return false;
    }
    out->inhibit_policy_mapping = inhibit_policy_mapping;
  }

  // There should be no remaining data.
  if (sequence_parser.HasMore() || parser.HasMore()) {
    return false;
  }

  return true;
}